

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O3

void kbd_callback(char *name,int name_len,char *instruct,int instruct_len,int num_prompts,
                 LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts,LIBSSH2_USERAUTH_KBDINT_RESPONSE *responses
                 ,void **abstract)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  size_t *psVar3;
  ulong uVar4;
  
  fprintf(_stdout,"Kb-int name: %.*s\n",name_len,name);
  fprintf(_stdout,"Kb-int instruction: %.*s\n",(ulong)(uint)instruct_len,instruct);
  if (0 < num_prompts) {
    psVar3 = &prompts->length;
    uVar4 = 0;
    do {
      fprintf(_stdout,"Kb-int prompt %d: %.*s\n",uVar4 & 0xffffffff,(ulong)(uint)*psVar3,
              ((LIBSSH2_USERAUTH_KBDINT_PROMPT *)(psVar3 + -1))->text);
      __s = kbd_password;
      uVar4 = uVar4 + 1;
      psVar3 = psVar3 + 3;
    } while ((uint)num_prompts != uVar4);
    if (num_prompts == 1) {
      pcVar1 = strdup(kbd_password);
      responses->text = pcVar1;
      sVar2 = strlen(__s);
      responses->length = (uint)sVar2;
    }
  }
  return;
}

Assistant:

static void kbd_callback(const char *name, int name_len,
                         const char *instruct, int instruct_len,
                         int num_prompts,
                         const LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts,
                         LIBSSH2_USERAUTH_KBDINT_RESPONSE *responses,
                         void **abstract)
{
    int i;
    (void)abstract;

    fprintf(stdout, "Kb-int name: %.*s\n", name_len, name);
    fprintf(stdout, "Kb-int instruction: %.*s\n", instruct_len, instruct);
    for(i = 0; i < num_prompts; ++i) {
        fprintf(stdout, "Kb-int prompt %d: %.*s\n", i,
                (int)prompts[i].length, prompts[i].text);
    }

    if(num_prompts == 1) {
        responses[0].text = strdup(kbd_password);
        responses[0].length = (unsigned int)strlen(kbd_password);
    }
}